

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O2

string * __thiscall
cmLocalUnixMakefileGenerator3::ConvertToFullPath
          (string *__return_storage_ptr__,cmLocalUnixMakefileGenerator3 *this,string *localPath)

{
  string *psVar1;
  cmAlphaNum local_70;
  cmAlphaNum local_40;
  
  psVar1 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_((cmLocalGenerator *)this);
  local_40.View_._M_str = (psVar1->_M_dataplus)._M_p;
  local_40.View_._M_len = psVar1->_M_string_length;
  local_70.View_._M_str = local_70.Digits_;
  local_70.View_._M_len = 1;
  local_70.Digits_[0] = '/';
  cmStrCat<std::__cxx11::string>(__return_storage_ptr__,&local_40,&local_70,localPath);
  return __return_storage_ptr__;
}

Assistant:

std::string cmLocalUnixMakefileGenerator3::ConvertToFullPath(
  const std::string& localPath)
{
  std::string dir =
    cmStrCat(this->GetCurrentBinaryDirectory(), '/', localPath);
  return dir;
}